

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeDeleteRowid(Rtree *pRtree,sqlite3_int64 iDelete)

{
  int iVar1;
  i64 iNode;
  i64 iChild;
  RtreeNode *pChild;
  int rc2_1;
  int rc2;
  RtreeNode *pRoot;
  RtreeNode *pRStack_28;
  int iCell;
  RtreeNode *pLeaf;
  sqlite3_int64 sStack_18;
  int rc;
  sqlite3_int64 iDelete_local;
  Rtree *pRtree_local;
  
  pRStack_28 = (RtreeNode *)0x0;
  _rc2_1 = (RtreeNode *)0x0;
  sStack_18 = iDelete;
  iDelete_local = (sqlite3_int64)pRtree;
  pLeaf._4_4_ = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&rc2_1);
  if (pLeaf._4_4_ == 0) {
    pLeaf._4_4_ = findLeafNode((Rtree *)iDelete_local,sStack_18,&stack0xffffffffffffffd8,
                               (sqlite3_int64 *)0x0);
  }
  if ((pLeaf._4_4_ == 0) && (pRStack_28 != (RtreeNode *)0x0)) {
    pLeaf._4_4_ = nodeRowidIndex((Rtree *)iDelete_local,pRStack_28,sStack_18,
                                 (int *)((long)&pRoot + 4));
    if (pLeaf._4_4_ == 0) {
      pLeaf._4_4_ = deleteCell((Rtree *)iDelete_local,pRStack_28,pRoot._4_4_,0);
    }
    pChild._4_4_ = nodeRelease((Rtree *)iDelete_local,pRStack_28);
    if (pLeaf._4_4_ == 0) {
      pLeaf._4_4_ = pChild._4_4_;
    }
  }
  if (pLeaf._4_4_ == 0) {
    sqlite3_bind_int64(*(sqlite3_stmt **)(iDelete_local + 0x98),1,sStack_18);
    sqlite3_step(*(sqlite3_stmt **)(iDelete_local + 0x98));
    pLeaf._4_4_ = sqlite3_reset(*(sqlite3_stmt **)(iDelete_local + 0x98));
  }
  if (((pLeaf._4_4_ == 0) && (0 < *(int *)(iDelete_local + 0x2c))) &&
     (iVar1 = readInt16(_rc2_1->zData + 2), iVar1 == 1)) {
    iChild = 0;
    iNode = nodeGetRowid((Rtree *)iDelete_local,_rc2_1,0);
    pLeaf._4_4_ = nodeAcquire((Rtree *)iDelete_local,iNode,_rc2_1,(RtreeNode **)&iChild);
    if (pLeaf._4_4_ == 0) {
      pLeaf._4_4_ = removeNode((Rtree *)iDelete_local,(RtreeNode *)iChild,
                               *(int *)(iDelete_local + 0x2c) + -1);
    }
    pChild._0_4_ = nodeRelease((Rtree *)iDelete_local,(RtreeNode *)iChild);
    if (pLeaf._4_4_ == 0) {
      pLeaf._4_4_ = (int)pChild;
    }
    if (pLeaf._4_4_ == 0) {
      *(int *)(iDelete_local + 0x2c) = *(int *)(iDelete_local + 0x2c) + -1;
      writeInt16(_rc2_1->zData,*(int *)(iDelete_local + 0x2c));
      _rc2_1->isDirty = 1;
    }
  }
  pRStack_28 = *(RtreeNode **)(iDelete_local + 0x60);
  while (pRStack_28 != (RtreeNode *)0x0) {
    if (pLeaf._4_4_ == 0) {
      pLeaf._4_4_ = reinsertNodeContent((Rtree *)iDelete_local,pRStack_28);
    }
    *(RtreeNode **)(iDelete_local + 0x60) = pRStack_28->pNext;
    *(int *)(iDelete_local + 0x54) = *(int *)(iDelete_local + 0x54) + -1;
    sqlite3_free(pRStack_28);
    pRStack_28 = *(RtreeNode **)(iDelete_local + 0x60);
  }
  if (pLeaf._4_4_ == 0) {
    pLeaf._4_4_ = nodeRelease((Rtree *)iDelete_local,_rc2_1);
  }
  else {
    nodeRelease((Rtree *)iDelete_local,_rc2_1);
  }
  return pLeaf._4_4_;
}

Assistant:

static int rtreeDeleteRowid(Rtree *pRtree, sqlite3_int64 iDelete){
  int rc;                         /* Return code */
  RtreeNode *pLeaf = 0;           /* Leaf node containing record iDelete */
  int iCell;                      /* Index of iDelete cell in pLeaf */
  RtreeNode *pRoot = 0;           /* Root node of rtree structure */


  /* Obtain a reference to the root node to initialize Rtree.iDepth */
  rc = nodeAcquire(pRtree, 1, 0, &pRoot);

  /* Obtain a reference to the leaf node that contains the entry 
  ** about to be deleted. 
  */
  if( rc==SQLITE_OK ){
    rc = findLeafNode(pRtree, iDelete, &pLeaf, 0);
  }

#ifdef CORRUPT_DB
  assert( pLeaf!=0 || rc!=SQLITE_OK || CORRUPT_DB );
#endif

  /* Delete the cell in question from the leaf node. */
  if( rc==SQLITE_OK && pLeaf ){
    int rc2;
    rc = nodeRowidIndex(pRtree, pLeaf, iDelete, &iCell);
    if( rc==SQLITE_OK ){
      rc = deleteCell(pRtree, pLeaf, iCell, 0);
    }
    rc2 = nodeRelease(pRtree, pLeaf);
    if( rc==SQLITE_OK ){
      rc = rc2;
    }
  }

  /* Delete the corresponding entry in the <rtree>_rowid table. */
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pRtree->pDeleteRowid, 1, iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    rc = sqlite3_reset(pRtree->pDeleteRowid);
  }

  /* Check if the root node now has exactly one child. If so, remove
  ** it, schedule the contents of the child for reinsertion and 
  ** reduce the tree height by one.
  **
  ** This is equivalent to copying the contents of the child into
  ** the root node (the operation that Gutman's paper says to perform 
  ** in this scenario).
  */
  if( rc==SQLITE_OK && pRtree->iDepth>0 && NCELL(pRoot)==1 ){
    int rc2;
    RtreeNode *pChild = 0;
    i64 iChild = nodeGetRowid(pRtree, pRoot, 0);
    rc = nodeAcquire(pRtree, iChild, pRoot, &pChild);
    if( rc==SQLITE_OK ){
      rc = removeNode(pRtree, pChild, pRtree->iDepth-1);
    }
    rc2 = nodeRelease(pRtree, pChild);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK ){
      pRtree->iDepth--;
      writeInt16(pRoot->zData, pRtree->iDepth);
      pRoot->isDirty = 1;
    }
  }

  /* Re-insert the contents of any underfull nodes removed from the tree. */
  for(pLeaf=pRtree->pDeleted; pLeaf; pLeaf=pRtree->pDeleted){
    if( rc==SQLITE_OK ){
      rc = reinsertNodeContent(pRtree, pLeaf);
    }
    pRtree->pDeleted = pLeaf->pNext;
    pRtree->nNodeRef--;
    sqlite3_free(pLeaf);
  }

  /* Release the reference to the root node. */
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRoot);
  }else{
    nodeRelease(pRtree, pRoot);
  }

  return rc;
}